

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::DoubleOption::giveRndValue(DoubleOption *this,string *optionText)

{
  int iVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *__rhs;
  ostringstream strs;
  double rndV;
  string local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  string local_1e0 [32];
  string local_1c0 [48];
  ostringstream local_190 [376];
  char *local_18;
  string *local_10;
  
  if (((byte)in_RDI[0x40] & 1) == 0) {
    __rhs = (char *)(*(double *)(in_RDI + 0x30) + 1e-06);
  }
  else {
    __rhs = *(char **)(in_RDI + 0x30);
  }
  local_18 = __rhs;
  local_10 = in_RSI;
  iVar1 = rand();
  for (local_18 = (char *)((double)iVar1 + (double)local_18);
      *(double *)(in_RDI + 0x38) <= (double)local_18 &&
      (double)local_18 != *(double *)(in_RDI + 0x38);
      local_18 = (char *)((double)local_18 -
                         (*(double *)(in_RDI + 0x38) - *(double *)(in_RDI + 0x30)))) {
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,(double)local_18);
  std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::operator+(in_RDI,__rhs);
  std::__cxx11::ostringstream::str();
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::string::operator=(local_10,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        double rndV = range.begin_inclusive ? range.begin : range.begin + 0.000001;
        rndV += rand();
        while (rndV > range.end) {
            rndV -= range.end - range.begin;
        }
        std::ostringstream strs;
        strs << rndV;
        optionText = "-" + optionText + "=" + strs.str();
    }